

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void C_DoCommand(char *cmd,int keynum)

{
  char cVar1;
  char *__s2;
  int iVar2;
  DWORD key;
  FButtonStatus *this;
  FConsoleCommand *command;
  FBaseCVar *this_00;
  undefined4 extraout_var;
  DStoredCommand *this_01;
  size_t in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  FConsoleCommand **table;
  uint uVar3;
  FConsoleCommand **ppFVar4;
  FConsoleCommand **ppFVar5;
  char *pcVar6;
  size_t sStack_60;
  FCommandLine args;
  
  do {
    table = (FConsoleCommand **)cmd;
    cVar1 = *(char *)table;
    cmd = (char *)((long)table + 1);
    if (cVar1 == '\0') break;
  } while (cVar1 < '!');
  ppFVar4 = (FConsoleCommand **)cmd;
  ppFVar5 = table;
  if (cVar1 == '\"') {
    for (; (table = (FConsoleCommand **)cmd, *(char *)ppFVar4 != '\0' && (*(char *)ppFVar4 != '\"'))
        ; ppFVar4 = (FConsoleCommand **)((long)ppFVar4 + 1)) {
    }
  }
  else {
    do {
      pcVar6 = (char *)((long)ppFVar5 + 1);
      ppFVar4 = (FConsoleCommand **)((long)ppFVar5 + 1);
      ppFVar5 = ppFVar4;
    } while (' ' < *pcVar6);
  }
  pcVar6 = (char *)((long)ppFVar4 - (long)table);
  if (ParsingKeyConf) {
    uVar3 = 8;
    while( true ) {
      if ((int)uVar3 < 0) {
        Printf("Invalid command for KEYCONF: %s\n",table);
        return;
      }
      __s2 = KeyConfCommands[uVar3];
      iVar2 = strncasecmp((char *)table,__s2,(size_t)pcVar6);
      if ((iVar2 == 0) && (in_RDX = extraout_RDX, __s2[(long)pcVar6] == '\0')) break;
      uVar3 = uVar3 - 1;
    }
  }
  if ((*(char *)table == '-') || (*(char *)table == '+')) {
    key = SuperFastHashI((char *)((long)table + 1),(size_t)(pcVar6 + -1));
    this = FindButton(key);
    in_RDX = extraout_RDX_00;
    if (this != (FButtonStatus *)0x0) {
      if (*(char *)table == '+') {
        FButtonStatus::PressKey(this,keynum);
        return;
      }
      FButtonStatus::ReleaseKey(this,keynum);
      if (this != &Button_Mlook) {
        return;
      }
      if (lookspring.Value != true) {
        return;
      }
      Net_WriteByte('$');
      return;
    }
  }
  command = FindNameInHashTable(table,pcVar6,in_RDX);
  args.cmd = (char *)table;
  if (command == (FConsoleCommand *)0x0) {
    this_00 = FindCVarSub((char *)table,(int)pcVar6);
    if (this_00 == (FBaseCVar *)0x0) {
      Printf("Unknown command \"%.*s\"\n",(ulong)pcVar6 & 0xffffffff,table);
      return;
    }
    args._argc = -1;
    args._argv = (char **)0x0;
    args.noescapes = false;
    iVar2 = FCommandLine::argc(&args);
    if (iVar2 < 2) {
      pcVar6 = this_00->Name;
      iVar2 = (*this_00->_vptr_FBaseCVar[3])(this_00,0xffffffffffffffff);
      Printf("\"%s\" is \"%s\"\n",pcVar6,CONCAT44(extraout_var,iVar2));
    }
    else {
      pcVar6 = FCommandLine::operator[](&args,1);
      FBaseCVar::CmdSet(this_00,pcVar6);
    }
    goto LAB_00375f0a;
  }
  if ((gamestate != GS_STARTUP) || (ParsingKeyConf != false)) goto LAB_00375ed0;
  switch(pcVar6) {
  case (char *)0x3:
    pcVar6 = "set";
    sStack_60 = 3;
    break;
  case (char *)0x4:
    iVar2 = strncasecmp((char *)table,"bind",4);
    if ((iVar2 == 0) || (iVar2 = strncasecmp((char *)table,"exec",4), iVar2 == 0))
    goto LAB_00375ed0;
    iVar2 = strncasecmp((char *)table,"warp",4);
    if (iVar2 == 0) {
      FString::operator=(&StoredWarp,(char *)table);
      return;
    }
  default:
    goto switchD_00375d16_caseD_5;
  case (char *)0x6:
    pcVar6 = "pullin";
    sStack_60 = 6;
    break;
  case (char *)0x7:
    pcVar6 = "logfile";
    sStack_60 = 7;
    break;
  case (char *)0x9:
    pcVar6 = "unbindall";
    sStack_60 = 9;
    break;
  case (char *)0xa:
    pcVar6 = "doublebind";
    sStack_60 = 10;
  }
  iVar2 = strncasecmp((char *)table,pcVar6,sStack_60);
  if (iVar2 == 0) {
LAB_00375ed0:
    args._argc = -1;
    args._argv = (char **)0x0;
    args.noescapes = false;
    (*command->_vptr_FConsoleCommand[3])
              (command,&args,(&players)[(long)consoleplayer * 0x54],keynum);
LAB_00375f0a:
    FCommandLine::~FCommandLine(&args);
  }
  else {
switchD_00375d16_caseD_5:
    this_01 = (DStoredCommand *)DObject::operator_new(0x48);
    DStoredCommand::DStoredCommand(this_01,command,(char *)table);
  }
  return;
}

Assistant:

void C_DoCommand (const char *cmd, int keynum)
{
	FConsoleCommand *com;
	const char *end;
	const char *beg;

	// Skip any beginning whitespace
	while (*cmd && *cmd <= ' ')
		cmd++;

	// Find end of the command name
	if (*cmd == '\"')
	{
		for (end = beg = cmd+1; *end && *end != '\"'; ++end)
			;
	}
	else
	{
		beg = cmd;
		for (end = cmd+1; *end > ' '; ++end)
			;
	}

	const size_t len = end - beg;

	if (ParsingKeyConf)
	{
		int i;

		for (i = countof(KeyConfCommands)-1; i >= 0; --i)
		{
			if (strnicmp (beg, KeyConfCommands[i], len) == 0 &&
				KeyConfCommands[i][len] == 0)
			{
				break;
			}
		}
		if (i < 0)
		{
			Printf ("Invalid command for KEYCONF: %s\n", beg);
			return;
		}
	}

	// Check if this is an action
	if (*beg == '+' || *beg == '-')
	{
		FButtonStatus *button;

		button = FindButton (MakeKey (beg + 1, end - beg - 1));
		if (button != NULL)
		{
			if (*beg == '+')
			{
				button->PressKey (keynum);
			}
			else
			{
				button->ReleaseKey (keynum);
				if (button == &Button_Mlook && lookspring)
				{
					Net_WriteByte (DEM_CENTERVIEW);
				}
			}
			return;
		}
	}
	
	// Parse it as a normal command
	// Checking for matching commands follows this search order:
	//	1. Check the Commands[] hash table
	//	2. Check the CVars list

	if ( (com = FindNameInHashTable (Commands, beg, len)) )
	{
		if (gamestate != GS_STARTUP || ParsingKeyConf ||
			(len == 3 && strnicmp (beg, "set", 3) == 0) ||
			(len == 7 && strnicmp (beg, "logfile", 7) == 0) ||
			(len == 9 && strnicmp (beg, "unbindall", 9) == 0) ||
			(len == 4 && strnicmp (beg, "bind", 4) == 0) ||
			(len == 4 && strnicmp (beg, "exec", 4) == 0) ||
			(len ==10 && strnicmp (beg, "doublebind", 10) == 0) ||
			(len == 6 && strnicmp (beg, "pullin", 6) == 0)
			)
		{
			FCommandLine args (beg);
			com->Run (args, players[consoleplayer].mo, keynum);
		}
		else
		{
			if (len == 4 && strnicmp(beg, "warp", 4) == 0)
			{
				StoredWarp = beg;
			}
			else
			{
				new DStoredCommand (com, beg);
			}
		}
	}
	else
	{ // Check for any console vars that match the command
		FBaseCVar *var = FindCVarSub (beg, int(len));

		if (var != NULL)
		{
			FCommandLine args (beg);

			if (args.argc() >= 2)
			{ // Set the variable
				var->CmdSet (args[1]);
			}
			else
			{ // Get the variable's value
				Printf ("\"%s\" is \"%s\"\n", var->GetName(), var->GetHumanString());
			}
		}
		else
		{ // We don't know how to handle this command
			Printf ("Unknown command \"%.*s\"\n", (int)len, beg);
		}
	}
}